

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

ON_SubDEdge * __thiscall ON_SubDHeap::EdgeFromId(ON_SubDHeap *this,uint edge_id)

{
  uint uVar1;
  ON_SubDEdge *edge;
  uint edge_id_local;
  ON_SubDHeap *this_local;
  
  if ((edge_id == 0) || (edge_id == 0xffffffff)) {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubDHeap *)0x0;
  }
  else {
    this_local = (ON_SubDHeap *)
                 ON_FixedSizePool::ElementFromId(&this->m_fspe,m_offset_edge_id,edge_id);
    if ((this_local == (ON_SubDHeap *)0x0) ||
       (edge_id != *(uint *)&(this_local->m_fspv).m_first_block)) {
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubDHeap *)0x0;
    }
    else {
      uVar1 = ON_SubDComponentBase::ArchiveId((ON_SubDComponentBase *)this_local);
      if (uVar1 == 0xffffffff) {
        ON_SubDIncrementErrorCount();
        this_local = (ON_SubDHeap *)0x0;
      }
    }
  }
  return (ON_SubDEdge *)this_local;
}

Assistant:

const class ON_SubDEdge* ON_SubDHeap::EdgeFromId(
  unsigned int edge_id
  ) const
{
  if ( 0 == edge_id || ON_UNSET_UINT_INDEX == edge_id)
    return ON_SUBD_RETURN_ERROR(nullptr);
  const class ON_SubDEdge* edge = (const class ON_SubDEdge*)m_fspe.ElementFromId(ON_SubDHeap::m_offset_edge_id,edge_id);
  if ( nullptr == edge || edge_id != edge->m_id)
    return ON_SUBD_RETURN_ERROR(nullptr);
  if ( ON_UNSET_UINT_INDEX == edge->ArchiveId() )
    return ON_SUBD_RETURN_ERROR(nullptr);
  return edge;
}